

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TexBindingCase::init
          (TexBindingCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  RenderContext *pRVar2;
  undefined7 extraout_var;
  ContextInfo *pCVar4;
  NotSupportedError *pNVar5;
  undefined7 extraout_var_00;
  allocator<char> local_99;
  string local_98;
  undefined1 local_72;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  TexBindingCase *local_10;
  TexBindingCase *this_local;
  TexBindingCase *pTVar3;
  
  local_10 = this;
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
  pTVar3 = (TexBindingCase *)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    if (this->m_texTarget == 0x9102) {
      pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (pCVar4,"GL_OES_texture_storage_multisample_2d_array");
      if (!bVar1) {
        local_4d = 1;
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,
                   "Test requires OES_texture_storage_multisample_2d_array extension",&local_39);
        tcu::NotSupportedError::NotSupportedError(pNVar5,&local_38);
        local_4d = 0;
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
    if (this->m_texTarget == 0x9009) {
      pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_texture_cube_map_array");
      if (!bVar1) {
        local_72 = 1;
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Test requires GL_EXT_texture_cube_map_array extension",
                   &local_71);
        tcu::NotSupportedError::NotSupportedError(pNVar5,&local_70);
        local_72 = 0;
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
    pTVar3 = this;
    if (this->m_texTarget == 0x8c2a) {
      pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_texture_buffer");
      pTVar3 = (TexBindingCase *)CONCAT71(extraout_var_00,bVar1);
      if (!bVar1) {
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Test requires GL_EXT_texture_buffer extension",&local_99);
        tcu::NotSupportedError::NotSupportedError(pNVar5,&local_98);
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
  }
  return (int)pTVar3;
}

Assistant:

void TexBindingCase::init (void)
{
	if (contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		return;

	if (m_texTarget == GL_TEXTURE_2D_MULTISAMPLE_ARRAY && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		throw tcu::NotSupportedError("Test requires OES_texture_storage_multisample_2d_array extension");
	if (m_texTarget == GL_TEXTURE_CUBE_MAP_ARRAY && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_cube_map_array"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_cube_map_array extension");
	if (m_texTarget == GL_TEXTURE_BUFFER && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_buffer extension");
}